

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O3

ostream * KokkosTools::ChromeTracing::operator<<(ostream *os,StackKind kind)

{
  long lVar1;
  char *pcVar2;
  
  switch(kind) {
  case STACK_FOR:
    pcVar2 = "[for]";
    lVar1 = 5;
    goto LAB_00103548;
  case STACK_REDUCE:
    pcVar2 = "[reduce]";
    break;
  case STACK_SCAN:
    pcVar2 = "[scan]";
    goto LAB_0010352c;
  case STACK_REGION:
    pcVar2 = "[region]";
    break;
  case STACK_COPY:
    pcVar2 = "[copy]";
LAB_0010352c:
    lVar1 = 6;
    goto LAB_00103548;
  default:
    goto switchD_0010350c_default;
  }
  lVar1 = 8;
LAB_00103548:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
switchD_0010350c_default:
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, StackKind kind) {
  switch (kind) {
    case STACK_FOR: os << "[for]"; break;
    case STACK_REDUCE: os << "[reduce]"; break;
    case STACK_SCAN: os << "[scan]"; break;
    case STACK_REGION: os << "[region]"; break;
    case STACK_COPY: os << "[copy]"; break;
  };
  return os;
}